

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O0

Am_Formula Am_From_Object(Am_Object *object,Am_Slot_Key key)

{
  Object_Key_Store_Data *this;
  Am_Slot_Key in_DX;
  Am_Formula_Data *extraout_RDX;
  undefined6 in_register_00000032;
  Am_Formula AVar1;
  Am_Object local_38 [3];
  undefined1 local_1b;
  Am_Slot_Key local_1a;
  Am_Object *pAStack_18;
  Am_Slot_Key key_local;
  Am_Object *object_local;
  Am_Formula *formula;
  
  local_1b = 0;
  local_1a = in_DX;
  pAStack_18 = (Am_Object *)CONCAT62(in_register_00000032,key);
  object_local = object;
  Am_Formula::Am_Formula((Am_Formula *)object,from_object_procedure,(char *)0x0);
  this = (Object_Key_Store_Data *)operator_new(0x20);
  Am_Object::Am_Object(local_38,(Am_Object *)CONCAT62(in_register_00000032,key));
  Object_Key_Store_Data::Object_Key_Store_Data(this,local_38,local_1a);
  Am_Formula::Set_Data((Am_Formula *)object,(Am_Wrapper *)this);
  Am_Object::~Am_Object(local_38);
  AVar1.data = extraout_RDX;
  AVar1.super_Am_Registered_Type._vptr_Am_Registered_Type = (_func_int **)object;
  return AVar1;
}

Assistant:

Am_Formula
Am_From_Object(Am_Object object, Am_Slot_Key key)
{
  Am_Formula formula(from_object_procedure, DSTR("Am_From_Object"));
  formula.Set_Data(new Object_Key_Store_Data(object, key));
  return formula;
}